

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_minnow_byt_compatible.c
# Opt level: O0

mraa_result_t mraa_intel_minnowboard_get_pin_index(mraa_board_t *board,char *name,int *pin_index)

{
  int iVar1;
  int local_2c;
  int i;
  int *pin_index_local;
  char *name_local;
  mraa_board_t *board_local;
  
  local_2c = 0;
  while( true ) {
    if (board->phy_pin_count <= local_2c) {
      return MRAA_ERROR_INVALID_RESOURCE;
    }
    iVar1 = strncmp(name,board->pins[local_2c].name,8);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  *pin_index = local_2c;
  return MRAA_SUCCESS;
}

Assistant:

mraa_result_t
mraa_intel_minnowboard_get_pin_index(mraa_board_t* board, char* name, int* pin_index)
{
    int i;
    for (i = 0; i < board->phy_pin_count; ++i) {
        if (strncmp(name, board->pins[i].name, MAX_LENGTH) == 0) {
            *pin_index = i;
            return MRAA_SUCCESS;
        }
    }
    return MRAA_ERROR_INVALID_RESOURCE;
}